

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  char *__path;
  int iVar1;
  int *piVar2;
  undefined8 extraout_RAX;
  allocator local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  do {
    iVar1 = close(*(int *)((long)child_arg + 8));
    if (iVar1 != -1) goto LAB_0011d5cc;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  std::__cxx11::string::string((string *)&local_50,"CHECK failed: File ",&local_119);
  std::operator+(&local_70,&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/lib/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_118,&local_70,", line ");
  local_74 = 0x470;
  StreamableToString<int>(&local_30,&local_74);
  std::operator+(&local_f8,&local_118,&local_30);
  std::operator+(&local_d8,&local_f8,": ");
  std::operator+(&local_b8,&local_d8,"close(args->close_fd)");
  std::operator+(&local_98,&local_b8," != -1");
  DeathTestAbort(&local_98);
LAB_0011d5cc:
  UnitTest::GetInstance();
  __path = ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_._M_dataplus.
           _M_p;
  iVar1 = chdir(__path);
  if (iVar1 == 0) {
    execve(**child_arg,*child_arg,_environ);
    std::__cxx11::string::string((string *)&local_70,"execve(",(allocator *)&local_30);
    std::operator+(&local_118,&local_70,(char *)**child_arg);
    std::operator+(&local_f8,&local_118,", ...) in ");
    std::operator+(&local_d8,&local_f8,__path);
    std::operator+(&local_b8,&local_d8," failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator+(&local_98,&local_b8,&local_50);
    DeathTestAbort(&local_98);
  }
  std::__cxx11::string::string((string *)&local_f8,"chdir(\"",(allocator *)&local_70);
  std::operator+(&local_d8,&local_f8,__path);
  std::operator+(&local_b8,&local_d8,"\") failed: ");
  GetLastErrnoDescription_abi_cxx11_();
  std::operator+(&local_98,&local_b8,&local_118);
  DeathTestAbort(&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execve() as it's a direct system call.  We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execve() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execve(args->argv[0], args->argv, GetEnviron());
  DeathTestAbort(std::string("execve(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " +
                 GetLastErrnoDescription());
  return EXIT_FAILURE;
}